

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::ReadAllBoardsBroadcast(BasePort *this)

{
  double *pdVar1;
  double dVar2;
  uchar *puVar3;
  BoardIO *pBVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ostream *poVar16;
  bool bVar17;
  ulong uVar18;
  bool bVar19;
  char *pcVar20;
  uint uVar21;
  bool *pbVar22;
  uint *__s;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar23;
  uint local_84;
  long *local_50 [2];
  long local_40 [2];
  
  iVar10 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar10 == '\0') {
    poVar16 = this->outStr;
    pcVar20 = "BasePort::ReadAllBoardsBroadcast: port not initialized";
    lVar15 = 0x36;
LAB_00110d03:
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar20,lVar15);
    lVar15 = *(long *)poVar16;
  }
  else {
    if (((this->IsAllBoardsRev4_6_ == false) && (this->IsAllBoardsRev7_ == false)) &&
       (this->IsAllBoardsRev8_9_ == false)) {
      poVar16 = this->outStr;
      pcVar20 = "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware";
      lVar15 = 0x39;
      goto LAB_00110d03;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ReadAllBoardsBroadcast","");
    iVar10 = (*this->_vptr_BasePort[0x1b])(this,(string *)local_50,(ulong)this->autoReScan);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((char)iVar10 == '\0') {
      uVar12 = this->max_board;
      if ((ulong)uVar12 != 0) {
        uVar18 = 0;
        do {
          pBVar4 = this->BoardList[uVar18];
          if (pBVar4 != (BoardIO *)0x0) {
            pBVar4->readValid = false;
            pBVar4->numReadErrors = pBVar4->numReadErrors + 1;
          }
          uVar18 = uVar18 + 1;
        } while (uVar12 != uVar18);
      }
      goto LAB_00110d32;
    }
    uVar11 = (this->bcReadInfo).readSequence + 1;
    uVar12 = 1;
    if (uVar11 != 0x10000) {
      uVar12 = uVar11;
    }
    (this->bcReadInfo).readSequence = uVar12;
    iVar10 = (*this->_vptr_BasePort[0x29])(this);
    if ((char)iVar10 != '\0') {
      (*this->_vptr_BasePort[0x2a])(this);
      (this->bcReadInfo).updateStartTime = 1.0;
      (this->bcReadInfo).updateFinishTime = 0.0;
      (this->bcReadInfo).updateOverflow = false;
      (this->bcReadInfo).readOverflow = false;
      lVar15 = 0x141;
      do {
        *(undefined1 *)((long)this->BoardList + lVar15 + -0x40) = 0;
        lVar15 = lVar15 + 0x20;
      } while (lVar15 != 0x341);
      puVar3 = this->ReadBufferBroadcast;
      uVar12 = (*this->_vptr_BasePort[0x18])(this);
      uVar11 = (*this->_vptr_BasePort[0x14])(this);
      __s = (uint *)(puVar3 + (ulong)uVar11 + (ulong)uVar12);
      memset(__s,0,(ulong)(this->bcReadInfo).readSizeQuads << 2);
      iVar10 = (*this->_vptr_BasePort[0x2b])
                         (this,__s,(ulong)((this->bcReadInfo).readSizeQuads << 2));
      if ((char)iVar10 == '\0') {
        uVar12 = this->max_board;
        if ((ulong)uVar12 != 0) {
          uVar18 = 0;
          do {
            pBVar4 = this->BoardList[uVar18];
            if (pBVar4 != (BoardIO *)0x0) {
              pBVar4->readValid = false;
              pBVar4->numReadErrors = pBVar4->numReadErrors + 1;
            }
            uVar18 = uVar18 + 1;
          } while (uVar12 != uVar18);
        }
        goto LAB_00110d32;
      }
      (*this->_vptr_BasePort[0x20])(this);
      dVar6 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      if (this->NumOfBoards_ == 0) {
        bVar9 = true;
      }
      else {
        local_84 = 0;
        bVar19 = true;
        bVar9 = true;
        uVar12 = 0;
        do {
          if ((*__s == 0) || (__s[2] == 0)) {
            poVar16 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"BasePort::ReadAllBoardsBroadcast: invalid block after reading ",0x3e
                      );
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," boards",7);
            std::endl<char,std::char_traits<char>>(poVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this->outStr,"Failed to read from board(s) ",0x1d);
            pbVar22 = &(this->bcReadInfo).boardInfo[0].updated;
            lVar15 = 0;
            do {
              if ((((BroadcastBoardInfo *)(pbVar22 + -1))->inUse == true) && (*pbVar22 == false)) {
                poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)this->outStr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              }
              lVar15 = lVar15 + 1;
              pbVar22 = pbVar22 + 0x20;
            } while (lVar15 != 0x10);
            std::endl<char,std::char_traits<char>>(this->outStr);
            goto LAB_0011108f;
          }
          uVar11 = __s[2] << 0x18;
          if (((uVar11 & 0xf0000000) != 0x40000000) && (this->IsAllBoardsRev8_9_ == false)) {
            poVar16 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,
                       "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): ",
                       0x47);
            *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) =
                 *(uint *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            lVar15 = *(long *)poVar16;
            *(uint *)(poVar16 + *(long *)(lVar15 + -0x18) + 0x18) =
                 *(uint *)(poVar16 + *(long *)(lVar15 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_0011106b:
            std::ios::widen((char)*(undefined8 *)(lVar15 + -0x18) + (char)poVar16);
            std::ostream::put((char)poVar16);
            std::ostream::flush();
            goto LAB_0011108f;
          }
          uVar21 = (uVar11 & 0xf000000) >> 0x18;
          iVar10 = (*this->_vptr_BasePort[0x1f])(this);
          uVar11 = uVar21;
          if ((char)iVar10 != '\0') {
            uVar11 = uVar12;
          }
          pBVar4 = this->BoardList[uVar11];
          if ((uVar11 != uVar21) && (pBVar4 != (BoardIO *)0x0)) {
            poVar16 = this->outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"BasePort::ReadAllBoardsBroadcast: board mismatch, expecting ",0x3c);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", found ",8);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            lVar15 = *(long *)poVar16;
            goto LAB_0011106b;
          }
          if ((pBVar4 == (BoardIO *)0x0) || ((this->bcReadInfo).boardInfo[uVar11].inUse == false)) {
            if (this->IsAllBoardsRev4_6_ != false) {
              __s = __s + 0x11;
            }
          }
          else {
            (this->bcReadInfo).boardInfo[uVar11].updated = true;
            (this->bcReadInfo).boardInfo[uVar11].blockNum = local_84;
            uVar14 = (*__s & 0xff00) << 8;
            uVar13 = (uVar14 | *__s << 0x18) >> 0x10;
            (this->bcReadInfo).boardInfo[uVar11].sequence = uVar13;
            uVar21 = (this->bcReadInfo).readSequence;
            if (this->IsAllBoardsRev8_9_ == true) {
              uVar21 = uVar21 & 0xff;
              uVar14 = uVar14 >> 0x10;
              (this->bcReadInfo).boardInfo[uVar11].sequence = uVar14;
              bVar17 = (bool)((byte)(*__s >> 0x17) & 1);
              if (uVar14 != uVar21) {
                bVar17 = true;
              }
              (this->bcReadInfo).boardInfo[uVar11].seq_error = bVar17;
              (this->bcReadInfo).boardInfo[uVar11].blockSize = (uint)(byte)*__s;
              uVar14 = (*pBVar4->_vptr_BoardIO[1])();
              if ((this->bcReadInfo).boardInfo[uVar11].blockSize != (uVar14 >> 2) + 1) {
                poVar16 = this->outStr;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,"BasePort::ReadAllBoardsBroadcast: board ",0x28);
                poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", blockSize = ",0xe);
                poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,", expected = ",0xd);
                poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                std::endl<char,std::char_traits<char>>(poVar16);
              }
            }
            else {
              (this->bcReadInfo).boardInfo[uVar11].seq_error = uVar13 != uVar21;
              uVar14 = 0x11;
              if (this->IsAllBoardsRev7_ != false) {
                uVar14 = 0x1d;
              }
              (this->bcReadInfo).boardInfo[uVar11].blockSize = uVar14;
            }
            if ((this->IsAllBoardsRev7_ == false) && (this->IsAllBoardsRev8_9_ == false)) {
              bVar8 = (this->bcReadInfo).boardInfo[uVar11].seq_error;
            }
            else {
              dVar7 = (double)(*__s >> 0x18 | (*__s & 0x7f0000) >> 8) * dVar6;
              (this->bcReadInfo).boardInfo[uVar11].updateTime = dVar7;
              bVar8 = (this->bcReadInfo).boardInfo[uVar11].seq_error;
              if ((bool)bVar8 == false) {
                dVar23 = (this->bcReadInfo).updateFinishTime;
                if (dVar7 < dVar23) {
                  dVar7 = dVar7 + *(double *)
                                   (&DAT_0011d240 +
                                   (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) * dVar6;
                  (this->bcReadInfo).boardInfo[uVar11].updateTime = dVar7;
                  (this->bcReadInfo).updateOverflow = true;
                }
                if (dVar7 < (this->bcReadInfo).updateStartTime) {
                  (this->bcReadInfo).updateStartTime = dVar7;
                }
                if (dVar23 < dVar7) {
                  (this->bcReadInfo).updateFinishTime = dVar7;
                }
              }
            }
            if ((bVar8 & 1) == 0) {
              pBVar4->readValid = true;
              (*pBVar4->_vptr_BoardIO[2])(pBVar4,__s + 1);
              bVar9 = false;
            }
            else {
              poVar16 = this->outStr;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"BasePort::ReadAllBoardsBroadcast: board ",0x28);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", seq = ",8);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", expected = ",0xd);
              poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,", diff = ",9);
              poVar16 = (ostream *)
                        std::ostream::operator<<
                                  ((ostream *)poVar16,
                                   uVar21 - (this->bcReadInfo).boardInfo[uVar11].sequence);
              std::endl<char,std::char_traits<char>>(poVar16);
              pBVar4->readValid = false;
              pBVar4->numReadErrors = pBVar4->numReadErrors + 1;
              bVar19 = false;
            }
            local_84 = local_84 + 1;
            __s = __s + (this->bcReadInfo).boardInfo[uVar11].blockSize;
          }
        } while ((uVar12 < 0xf) && (uVar12 = uVar12 + 1, local_84 < this->NumOfBoards_));
        if (!bVar19) {
LAB_0011108f:
          lVar15 = 0x50;
          do {
            lVar5 = *(long *)((long)this->BoardList + lVar15 + -0x50);
            if (((lVar5 != 0) && (*(char *)((long)this->BoardList + lVar15 * 4 + -0x40) == '\x01'))
               && (*(char *)((long)this->BoardList + lVar15 * 4 + -0x3f) == '\0')) {
              *(undefined1 *)(lVar5 + 0x18) = 0;
              *(int *)(lVar5 + 0x1c) = *(int *)(lVar5 + 0x1c) + 1;
            }
            lVar15 = lVar15 + 8;
          } while (lVar15 != 0xd0);
          (this->bcReadInfo).gapTime = 0.0;
          (this->bcReadInfo).readStartTime = 0.0;
          (this->bcReadInfo).readFinishTime = 0.0;
          bVar19 = false;
          goto LAB_001110d7;
        }
      }
      if ((this->IsAllBoardsRev7_ != false) || (this->IsAllBoardsRev8_9_ == true)) {
        uVar12 = *__s;
        dVar7 = (double)(((uVar12 & 0xff00) << 8 | uVar12 << 0x18) >> 0x10) * dVar6;
        (this->bcReadInfo).readStartTime = dVar7;
        dVar23 = (double)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8) * dVar6;
        (this->bcReadInfo).readFinishTime = dVar23;
        if (uVar12 == 0) {
          (this->bcReadInfo).gapTime = 0.0;
        }
        else {
          dVar2 = (this->bcReadInfo).updateFinishTime;
          if (dVar7 < dVar2) {
            dVar7 = dVar7 + *(double *)
                             (&DAT_0011d250 + (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8
                             ) * dVar6;
            (this->bcReadInfo).readStartTime = dVar7;
            (this->bcReadInfo).readOverflow = true;
          }
          if (dVar23 < dVar7) {
            (this->bcReadInfo).readFinishTime =
                 dVar6 * *(double *)
                          (&DAT_0011d250 + (ulong)(this->FirmwareVersion[this->HubBoard] < 9) * 8) +
                 dVar23;
            (this->bcReadInfo).readOverflow = true;
          }
          dVar7 = dVar7 - dVar2;
          (this->bcReadInfo).gapTime = dVar7;
          if (dVar7 < (this->bcReadInfo).gapTimeMin) {
            (this->bcReadInfo).gapTimeMin = dVar7;
          }
          pdVar1 = &(this->bcReadInfo).gapTimeMax;
          if (*pdVar1 <= dVar7 && dVar7 != *pdVar1) {
            (this->bcReadInfo).gapTimeMax = dVar7;
          }
        }
      }
      bVar19 = true;
LAB_001110d7:
      if (!bVar9) {
        return bVar19;
      }
      (*this->_vptr_BasePort[8])(this);
      return bVar19;
    }
    poVar16 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = ",
               0x4f);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    lVar15 = *(long *)poVar16;
  }
  std::ios::widen((char)*(undefined8 *)(lVar15 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
LAB_00110d32:
  (*this->_vptr_BasePort[8])(this);
  return false;
}

Assistant:

bool BasePort::ReadAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::ReadAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneRead();
        return false;
    }

    if (!CheckFwBusGeneration("ReadAllBoardsBroadcast", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    //--- send out broadcast read request -----

    bool rtRead = true;
    bcReadInfo.IncrementSequence();

    if (!WriteBroadcastReadRequest(bcReadInfo.readSequence)) {
        outStr << "BasePort::ReadAllBoardsBroadcast: failed to send broadcast read request, seq = "
               << bcReadInfo.readSequence << std::endl;
        OnNoneRead();
        return false;
    }

    // Wait for broadcast read data
    WaitBroadcastRead();

    bcReadInfo.PrepareForRead();

    quadlet_t *hubReadBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
    memset(hubReadBuffer, 0, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    bool ret = ReceiveBroadcastReadResponse(hubReadBuffer, bcReadInfo.readSizeQuads*sizeof(quadlet_t));
    if (!ret) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    double clkPeriod = GetBroadcastReadClockPeriod();
    quadlet_t *curPtr = hubReadBuffer;
    unsigned int bdCnt = 0;   // Number of board processed
    // Loop through all boards, processing the boards in use.
    // Note that prior to Firmware Rev 7, we always read data for all 16 boards.
    // Starting with Firmware Rev 9, the board data will generally not be in sequential order
    // (i.e., isBroadcastReadOrdered will return false) for the Ethernet-only interface.
    for (unsigned int index = 0; (index < BoardIO::MAX_BOARDS) && (bdCnt < NumOfBoards_); index++) {
        if ((curPtr[0] == 0) || (curPtr[2] == 0)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid block after reading "
                   << bdCnt << " boards" << std::endl;
            outStr << "Failed to read from board(s) ";
            for (size_t i = 0; i < BoardIO::MAX_BOARDS; i++) {
                if (bcReadInfo.boardInfo[i].inUse && !bcReadInfo.boardInfo[i].updated)
                    outStr << i << " ";
            }
            outStr << std::endl;
            allOK = false;
            break;
        }
        quadlet_t statusQuad = bswap_32(curPtr[2]);
        unsigned int numAxes = (statusQuad&0xf0000000)>>28;
        if (!IsAllBoardsRev8_9_ && (numAxes != 4)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: invalid status (not a 4 axis board): " << std::hex << statusQuad
                   << std::dec << std::endl;
            allOK = false;
            break;
        }
        unsigned int thisBoard = (statusQuad&0x0f000000)>>24;
        unsigned int boardNum = isBroadcastReadOrdered() ? index : thisBoard;
        BoardIO *board = BoardList[boardNum];
        if (board && (boardNum != thisBoard)) {
            outStr << "BasePort::ReadAllBoardsBroadcast: board mismatch, expecting "
                   << boardNum << ", found " << thisBoard << std::endl;
            allOK = false;
            break;
        }
        if (bcReadInfo.boardInfo[boardNum].inUse && board) {
            bool thisOK = false;
            bcReadInfo.boardInfo[boardNum].updated = true;
            bcReadInfo.boardInfo[boardNum].blockNum = bdCnt++;
            bcReadInfo.boardInfo[boardNum].sequence = bswap_32(curPtr[0]) >> 16;
            unsigned int seq_expected = bcReadInfo.readSequence;
            if (IsAllBoardsRev8_9_) {
                // For Rev 8+, only the LSB of the sequence is returned, but bit 15 also indicates
                // whether the 16-bit sequence number did not match on the FPGA side.
                seq_expected &= 0x00ff;
                bcReadInfo.boardInfo[boardNum].sequence &= 0x00ff;  // lowest byte only
                bcReadInfo.boardInfo[boardNum].seq_error = bswap_32(curPtr[0]) & 0x00008000;  // bit 15
                if (bcReadInfo.boardInfo[boardNum].sequence != seq_expected)
                    bcReadInfo.boardInfo[boardNum].seq_error = true;
                bcReadInfo.boardInfo[boardNum].blockSize = (bswap_32(curPtr[0]) & 0xff000000) >> 24;
                unsigned int bdReadSize = board->GetReadNumBytes()/sizeof(quadlet_t) + 1;
                if (bcReadInfo.boardInfo[boardNum].blockSize != bdReadSize) {
                    outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                           << ", blockSize = " << bcReadInfo.boardInfo[boardNum].blockSize
                           << ", expected = " << bdReadSize << std::endl;
                }
            }
            else {
                bcReadInfo.boardInfo[boardNum].seq_error = (bcReadInfo.boardInfo[boardNum].sequence != seq_expected);
                // Rev7 block size is 29 (1 + 28), Rev4_6 block size is 17 (should have been 21)
                bcReadInfo.boardInfo[boardNum].blockSize = IsAllBoardsRev7_ ? 29 : 17;
            }
            if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
                unsigned int quad0_lsb = bswap_32(curPtr[0])&0x0000ffff;
                bcReadInfo.boardInfo[boardNum].updateTime = (quad0_lsb&0x7fff)*clkPeriod;
                if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                    // Set the update Start/Finish times based on the minimum and maximum update times
                    // Note that update times should be increasing, so if our current updateTime is
                    // less than the previous max (updateFinishTime), then there must have been overflow
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateFinishTime) {
                        // Firmware Rev 9 uses 15 bits; prior versions use 14 bits
                        uint16_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x4000 : 0x8000;
                        bcReadInfo.boardInfo[boardNum].updateTime += overflow_val*clkPeriod;
                        bcReadInfo.updateOverflow = true;
                    }
                    if (bcReadInfo.boardInfo[boardNum].updateTime < bcReadInfo.updateStartTime)
                        bcReadInfo.updateStartTime = bcReadInfo.boardInfo[boardNum].updateTime;
                    if (bcReadInfo.boardInfo[boardNum].updateTime > bcReadInfo.updateFinishTime)
                        bcReadInfo.updateFinishTime = bcReadInfo.boardInfo[boardNum].updateTime;
                }
            }
            if (!bcReadInfo.boardInfo[boardNum].seq_error) {
                thisOK = true;
            }
            else {
                outStr << "BasePort::ReadAllBoardsBroadcast: board " << boardNum
                       << ", seq = " << bcReadInfo.boardInfo[boardNum].sequence
                       << ", expected = " << seq_expected
                       << ", diff = " << static_cast<int>(seq_expected-bcReadInfo.boardInfo[boardNum].sequence)
                       << std::endl;
            }
            board->SetReadValid(thisOK);
            if (thisOK) {
                board->SetReadData(curPtr+1);
                noneRead = false;
            }
            else {
                allOK = false;
            }
            curPtr += bcReadInfo.boardInfo[boardNum].blockSize;
        }
        else if (IsAllBoardsRev4_6_) {
            // Skip unused boards for firmware < 7
            // Rev4_6 block size is 17 (should have been 21)
            curPtr += 17;
        }
    }

    if (!allOK) {
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            BoardIO *board = BoardList[bnum];
            if (board && bcReadInfo.boardInfo[bnum].inUse && !bcReadInfo.boardInfo[bnum].updated) {
               board->SetReadValid(false);
            }
        }
        bcReadInfo.readStartTime = 0.0;
        bcReadInfo.readFinishTime = 0.0;
        bcReadInfo.gapTime = 0.0;
    }
    else if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        quadlet_t timingInfo = bswap_32(curPtr[0]);
        bcReadInfo.readStartTime = ((timingInfo&0xffff0000) >> 16)*clkPeriod;
        bcReadInfo.readFinishTime = (timingInfo&0x0000ffff)*clkPeriod;
        if (timingInfo != 0) {
            // timingInfo == 0 indicates invalid data
            if (bcReadInfo.readStartTime < bcReadInfo.updateFinishTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readStartTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
            if (bcReadInfo.readFinishTime < bcReadInfo.readStartTime) {
                // Firmware Rev 9 uses 16 bits; prior versions use 14 bits
                uint32_t overflow_val = (FirmwareVersion[HubBoard] < 9) ? 0x00004000 : 0x00010000;
                bcReadInfo.readFinishTime += overflow_val*clkPeriod;
                bcReadInfo.readOverflow = true;
            }
        }
        // Gap between end of update and start of read; this can be tuned to be as
        // close to 0 as possible.
        if (timingInfo == 0) {
            bcReadInfo.gapTime = 0.0;
        }
        else {
            bcReadInfo.gapTime = bcReadInfo.readStartTime - bcReadInfo.updateFinishTime;
            if (bcReadInfo.gapTime < bcReadInfo.gapTimeMin)
                bcReadInfo.gapTimeMin = bcReadInfo.gapTime;
            if (bcReadInfo.gapTime > bcReadInfo.gapTimeMax)
                bcReadInfo.gapTimeMax = bcReadInfo.gapTime;
        }
    }

    if (noneRead) {
        OnNoneRead();
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoardsBroadcast: rtRead is false" << std::endl;

#if 0
    if (IsAllBoardsRev7_ || IsAllBoardsRev8_9_) {
        bcReadInfo.PrintTiming(outStr);
    }
#endif

    return allOK;
}